

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnVector<absl::int128>::Append(ColumnVector<absl::int128> *this,ColumnRef *column)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  iterator this_00;
  Column *in_RSI;
  shared_ptr<clickhouse::ColumnVector<absl::int128>_> col;
  vector<absl::int128,_std::allocator<absl::int128>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_absl::int128_*,_std::vector<absl::int128,_std::allocator<absl::int128>_>_>
  *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffffd8;
  __shared_ptr local_20 [32];
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x218843);
  Column::As<clickhouse::ColumnVector<absl::int128>>(in_RSI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    __first = std::vector<absl::int128,_std::allocator<absl::int128>_>::end
                        (in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<absl::int128_const*,std::vector<absl::int128,std::allocator<absl::int128>>>::
    __normal_iterator<absl::int128*>
              (in_stack_ffffffffffffff80,
               (__normal_iterator<absl::int128_*,_std::vector<absl::int128,_std::allocator<absl::int128>_>_>
                *)in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<absl::int128>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<clickhouse::ColumnVector<absl::int128>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x218899);
    __last = std::vector<absl::int128,_std::allocator<absl::int128>_>::begin
                       (in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<absl::int128>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<clickhouse::ColumnVector<absl::int128>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2188b4);
    this_00 = std::vector<absl::int128,_std::allocator<absl::int128>_>::end
                        (in_stack_ffffffffffffff78);
    std::vector<absl::int128,std::allocator<absl::int128>>::
    insert<__gnu_cxx::__normal_iterator<absl::int128*,std::vector<absl::int128,std::allocator<absl::int128>>>,void>
              ((vector<absl::int128,_std::allocator<absl::int128>_> *)this_00._M_current,
               in_stack_ffffffffffffffd8,
               (__normal_iterator<absl::int128_*,_std::vector<absl::int128,_std::allocator<absl::int128>_>_>
                )__first._M_current,
               (__normal_iterator<absl::int128_*,_std::vector<absl::int128,_std::allocator<absl::int128>_>_>
                )__last._M_current);
  }
  std::shared_ptr<clickhouse::ColumnVector<absl::int128>_>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnVector<absl::int128>_> *)0x218915);
  return;
}

Assistant:

void ColumnVector<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnVector<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}